

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_space_lagrange_o1.h
# Opt level: O0

void __thiscall
lf::uscalfe::FeSpaceLagrangeO1<double>::FeSpaceLagrangeO1
          (FeSpaceLagrangeO1<double> *this,shared_ptr<const_lf::mesh::Mesh> *mesh_p)

{
  shared_ptr<lf::fe::FePoint<double>_> local_b8;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_a8;
  shared_ptr<lf::uscalfe::FeLagrangeO1Segment<double>_> local_98;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_88;
  shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>_> local_78;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_68 [2];
  shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>_> local_48;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_38;
  shared_ptr<const_lf::mesh::Mesh> local_28;
  shared_ptr<const_lf::mesh::Mesh> *local_18;
  shared_ptr<const_lf::mesh::Mesh> *mesh_p_local;
  FeSpaceLagrangeO1<double> *this_local;
  
  local_18 = mesh_p;
  mesh_p_local = (shared_ptr<const_lf::mesh::Mesh> *)this;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&local_28,mesh_p);
  std::make_shared<lf::uscalfe::FeLagrangeO1Tria<double>>();
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)&local_38,&local_48);
  std::make_shared<lf::uscalfe::FeLagrangeO1Quad<double>>();
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)local_68,&local_78);
  std::make_shared<lf::uscalfe::FeLagrangeO1Segment<double>>();
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<lf::uscalfe::FeLagrangeO1Segment<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)&local_88,&local_98);
  std::make_shared<lf::fe::FePoint<double>,int>((int *)&local_b8);
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<lf::fe::FePoint<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)&local_a8,&local_b8);
  UniformScalarFESpace<double>::UniformScalarFESpace
            (&this->super_UniformScalarFESpace<double>,&local_28,&local_38,local_68,&local_88,
             &local_a8);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_a8);
  std::shared_ptr<lf::fe::FePoint<double>_>::~shared_ptr(&local_b8);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_88);
  std::shared_ptr<lf::uscalfe::FeLagrangeO1Segment<double>_>::~shared_ptr(&local_98);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(local_68);
  std::shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>_>::~shared_ptr(&local_78);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_38);
  std::shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>_>::~shared_ptr(&local_48);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_28);
  (this->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>._vptr_ScalarFESpace =
       (_func_int **)&PTR_Mesh_00cae380;
  return;
}

Assistant:

explicit FeSpaceLagrangeO1(
      const std::shared_ptr<const lf::mesh::Mesh> &mesh_p)
      : UniformScalarFESpace<SCALAR>(
            mesh_p, std::make_shared<FeLagrangeO1Tria<SCALAR>>(),
            std::make_shared<FeLagrangeO1Quad<SCALAR>>(),
            std::make_shared<FeLagrangeO1Segment<SCALAR>>(),
            std::make_shared<fe::FePoint<SCALAR>>(1)) {}